

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O0

void anon_unknown.dwarf_242a12::writeCopyReadRIP
               (char *fileName,int width,int height,LineOrder lorder,LevelRoundingMode rmode,
               int xSize,int ySize,Compression comp,bool triggerBuffering,bool triggerSeeks)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  void *this;
  int *piVar7;
  undefined4 *puVar8;
  char *pcVar9;
  reference pvVar10;
  reference pvVar11;
  Array2D<Imath_3_2::half> *pAVar12;
  half *phVar13;
  float *pfVar14;
  Vec2<float> *this_00;
  Vec2<float> *v;
  ChannelList *this_01;
  ChannelList *pCVar15;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  LevelRoundingMode in_R8D;
  uint in_R9D;
  float fVar16;
  float fVar17;
  uint in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  int x;
  int y;
  int lx;
  int ly;
  int tileX_1;
  int tileY_1;
  FrameBuffer fb_1;
  int levelHeight_1;
  int levelWidth_1;
  int xlevel_1;
  int ylevel_1;
  int dy;
  int endTileY;
  int startTileY;
  Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> levels2;
  int numYLevels;
  int numXLevels;
  int dwy;
  int dwx;
  Box2i *dw;
  TiledInputFile in;
  int tileX;
  int tileY;
  vector<int,_std::allocator<int>_> tileXs;
  FrameBuffer fb;
  int levelHeight;
  int levelWidth;
  int sxlevel;
  int xlevel;
  vector<int,_std::allocator<int>_> tileYs;
  int sylevel;
  int ylevel;
  vector<int,_std::allocator<int>_> shuffled_yLevels;
  vector<int,_std::allocator<int>_> shuffled_xLevels;
  Rand32 rand1;
  int i;
  TiledOutputFile out;
  Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> levels;
  Header hdr;
  float in_stack_fffffffffffff958;
  float in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  int in_stack_fffffffffffff968;
  int in_stack_fffffffffffff96c;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff978;
  undefined4 in_stack_fffffffffffff97c;
  Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *in_stack_fffffffffffff980;
  long in_stack_fffffffffffff9b0;
  long in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  long in_stack_fffffffffffff9e8;
  Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *in_stack_fffffffffffff9f0;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  Slice local_2f8 [56];
  char local_2c0 [52];
  undefined4 local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  int local_278;
  int local_274;
  Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> local_270;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int *local_248;
  FrameBuffer local_240;
  vector<int,_std::allocator<int>_> local_210;
  Slice local_1f8 [56];
  char local_1c0 [52];
  undefined4 local_18c;
  int local_188;
  value_type local_184;
  int local_180;
  vector<int,_std::allocator<int>_> local_178;
  value_type local_15c;
  int local_158;
  vector<int,_std::allocator<int>_> local_150;
  vector<int,_std::allocator<int>_> local_130;
  int local_10c;
  undefined1 local_108 [60];
  TileDescription local_cc;
  Channel local_bc [28];
  Vec2<float> local_a0;
  Vec2<int> local_98;
  Vec2<int> local_90;
  Box local_88 [16];
  Vec2<int> local_78;
  Vec2<int> local_70;
  Box local_68 [16];
  TileDescription local_58 [3];
  byte local_1e;
  byte local_1d;
  uint local_1c;
  LevelRoundingMode local_18;
  int local_14;
  int local_10;
  int local_c;
  char *local_8;
  
  local_1d = in_stack_00000018 & 1;
  local_1e = in_stack_00000020 & 1;
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar6 = std::operator<<((ostream *)&std::cout,"LineOrder ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_14);
  poVar6 = std::operator<<(poVar6,", buffer ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_1d & 1));
  poVar6 = std::operator<<(poVar6,", seek ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(bool)(local_1e & 1));
  poVar6 = std::operator<<(poVar6,", levelMode 2, ");
  poVar6 = std::operator<<(poVar6,"roundingMode ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
  poVar6 = std::operator<<(poVar6,", compression ");
  this = (void *)std::ostream::operator<<(poVar6,in_stack_00000010);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<int>::Vec2(&local_70,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_78,local_c + -1,local_10 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffff970,
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
  Imath_3_2::Vec2<int>::Vec2(&local_90,0,0);
  Imath_3_2::Vec2<int>::Vec2(&local_98,local_c + -1,local_10 + -1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffff970,
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968),
             (Vec2<int> *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
  Imath_3_2::Vec2<float>::Vec2(&local_a0,0.0,0.0);
  Imf_3_4::Header::Header
            ((Header *)local_58,local_68,local_88,1.0,(Vec2 *)&local_a0,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  piVar7 = (int *)Imf_3_4::Header::compression();
  *piVar7 = in_stack_00000010;
  puVar8 = (undefined4 *)Imf_3_4::Header::lineOrder();
  *puVar8 = 0;
  pcVar9 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_bc,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar9,(Channel *)0x231e2f);
  Imf_3_4::TileDescription::TileDescription
            (&local_cc,local_1c,in_stack_00000008,RIPMAP_LEVELS,local_18);
  Imf_3_4::Header::setTileDescription(local_58);
  Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::Array2D
            ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)(local_108 + 0x20));
  poVar6 = std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  remove(local_8);
  pcVar9 = local_8;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)local_108,pcVar9,(Header *)local_58,iVar3);
  Imf_3_4::TiledOutputFile::numYLevels();
  Imf_3_4::TiledOutputFile::numXLevels();
  Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::resizeErase
            (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
             CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
  Imath_3_2::Rand32::Rand32
            ((Rand32 *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958));
  Imf_3_4::TiledOutputFile::numXLevels();
  std::allocator<int>::allocator((allocator<int> *)0x212ed9);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980,
             CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
             (allocator_type *)in_stack_fffffffffffff970);
  std::allocator<int>::~allocator((allocator<int> *)0x212f05);
  Imf_3_4::TiledOutputFile::numYLevels();
  std::allocator<int>::allocator((allocator<int> *)0x212f41);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980,
             CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
             (allocator_type *)in_stack_fffffffffffff970);
  std::allocator<int>::~allocator((allocator<int> *)0x212f6d);
  for (local_10c = 0; iVar3 = local_10c, iVar4 = Imf_3_4::TiledOutputFile::numXLevels(),
      iVar5 = local_10c, iVar3 < iVar4; local_10c = local_10c + 1) {
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_130,(long)local_10c);
    *pvVar10 = iVar5;
  }
  for (local_10c = 0; iVar3 = local_10c, iVar4 = Imf_3_4::TiledOutputFile::numYLevels(),
      iVar5 = local_10c, iVar3 < iVar4; local_10c = local_10c + 1) {
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_150,(long)local_10c);
    *pvVar10 = iVar5;
  }
  if ((local_1d & 1) != 0) {
    for (local_10c = 0; iVar3 = local_10c, iVar5 = Imf_3_4::TiledOutputFile::numXLevels(),
        iVar3 < iVar5; local_10c = local_10c + 1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_130,(long)local_10c);
      Imf_3_4::TiledOutputFile::numXLevels();
      fVar16 = Imath_3_2::Rand32::nextf
                         ((Rand32 *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                          in_stack_fffffffffffff95c,in_stack_fffffffffffff958);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&local_130,(long)(int)(fVar16 + 0.5));
      std::swap<int>(pvVar10,pvVar11);
    }
    for (local_10c = 0; iVar3 = local_10c, iVar5 = Imf_3_4::TiledOutputFile::numYLevels(),
        iVar3 < iVar5; local_10c = local_10c + 1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_150,(long)local_10c);
      Imf_3_4::TiledOutputFile::numYLevels();
      fVar16 = Imath_3_2::Rand32::nextf
                         ((Rand32 *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                          in_stack_fffffffffffff95c,in_stack_fffffffffffff958);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&local_150,(long)(int)(fVar16 + 0.5));
      std::swap<int>(pvVar10,pvVar11);
    }
  }
  for (local_158 = 0; iVar3 = local_158, iVar5 = Imf_3_4::TiledOutputFile::numYLevels(),
      iVar3 < iVar5; local_158 = local_158 + 1) {
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_150,(long)local_158);
    local_15c = *pvVar10;
    Imf_3_4::TiledOutputFile::numYTiles((int)local_108);
    std::allocator<int>::allocator((allocator<int> *)0x213406);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980,
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
               (allocator_type *)in_stack_fffffffffffff970);
    std::allocator<int>::~allocator((allocator<int> *)0x213432);
    for (local_10c = 0; iVar3 = local_10c,
        iVar4 = Imf_3_4::TiledOutputFile::numYTiles((int)local_108), iVar5 = local_10c,
        iVar3 < iVar4; local_10c = local_10c + 1) {
      if (local_14 == 1) {
        iVar3 = Imf_3_4::TiledOutputFile::numYTiles((int)local_108);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&local_178,(long)((iVar3 + -1) - local_10c));
        *pvVar10 = iVar5;
      }
      else {
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_178,(long)local_10c);
        *pvVar10 = iVar5;
      }
    }
    if ((local_1d & 1) != 0) {
      for (local_10c = 0; iVar3 = local_10c,
          iVar5 = Imf_3_4::TiledOutputFile::numYTiles((int)local_108), iVar3 < iVar5;
          local_10c = local_10c + 1) {
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_178,(long)local_10c);
        Imf_3_4::TiledOutputFile::numYTiles((int)local_108);
        fVar16 = Imath_3_2::Rand32::nextf
                           ((Rand32 *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                            in_stack_fffffffffffff95c,in_stack_fffffffffffff958);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&local_178,(long)(int)(fVar16 + 0.5));
        std::swap<int>(pvVar10,pvVar11);
      }
    }
    for (local_180 = 0; iVar3 = local_180, iVar5 = Imf_3_4::TiledOutputFile::numXLevels(),
        iVar3 < iVar5; local_180 = local_180 + 1) {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_130,(long)local_180);
      local_184 = *pvVar10;
      local_188 = Imf_3_4::TiledOutputFile::levelWidth((int)local_108);
      local_18c = Imf_3_4::TiledOutputFile::levelHeight((int)local_108);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::operator[]
                ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)(local_108 + 0x20),(long)local_15c);
      Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                ((Array2D<Imath_3_2::half> *)in_stack_fffffffffffff980,
                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                 (long)in_stack_fffffffffffff970);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::operator[]
                ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)(local_108 + 0x20),(long)local_15c);
      fillPixels(in_stack_fffffffffffff970,in_stack_fffffffffffff96c,in_stack_fffffffffffff968);
      Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x2137ef);
      pAVar12 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::operator[]
                          ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)(local_108 + 0x20),
                           (long)local_15c);
      phVar13 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](pAVar12 + local_184,0);
      in_stack_fffffffffffff968 = 0;
      in_stack_fffffffffffff960 = 0;
      in_stack_fffffffffffff958 = 1.4013e-45;
      Imf_3_4::Slice::Slice
                (local_1f8,HALF,(char *)phVar13,2,(long)local_188 * 2,1,1,0.0,false,false);
      Imf_3_4::FrameBuffer::insert(local_1c0,(Slice *)0x231e2f);
      Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)local_108);
      Imf_3_4::TiledOutputFile::numXTiles((int)local_108);
      std::allocator<int>::allocator((allocator<int> *)0x2138ec);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980,
                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                 (allocator_type *)in_stack_fffffffffffff970);
      std::allocator<int>::~allocator((allocator<int> *)0x213918);
      for (local_10c = 0; iVar3 = local_10c,
          iVar4 = Imf_3_4::TiledOutputFile::numXTiles((int)local_108), iVar5 = local_10c,
          iVar3 < iVar4; local_10c = local_10c + 1) {
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_210,(long)local_10c);
        *pvVar10 = iVar5;
      }
      if ((local_1d & 1) != 0) {
        for (local_10c = 0; iVar3 = local_10c,
            iVar5 = Imf_3_4::TiledOutputFile::numXTiles((int)local_108), iVar3 < iVar5;
            local_10c = local_10c + 1) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_210,(long)local_10c);
          Imf_3_4::TiledOutputFile::numXTiles((int)local_108);
          fVar16 = Imath_3_2::Rand32::nextf
                             ((Rand32 *)
                              CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
                              in_stack_fffffffffffff95c,in_stack_fffffffffffff958);
          pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&local_210,(long)(int)(fVar16 + 0.5));
          std::swap<int>(pvVar10,pvVar11);
        }
      }
      for (local_240._map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
          iVar3 = (int)local_240._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
          iVar5 = Imf_3_4::TiledOutputFile::numYTiles((int)local_108), iVar3 < iVar5;
          local_240._map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
               (int)local_240._map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
        for (local_240._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 0;
            iVar3 = local_240._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,
            iVar5 = Imf_3_4::TiledOutputFile::numXTiles((int)local_108), iVar3 < iVar5;
            local_240._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ =
                 local_240._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ + 1) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&local_210,
                               (long)local_240._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_right._4_4_);
          iVar3 = *pvVar10;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&local_178,
                               (long)(int)local_240._map._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
          Imf_3_4::TiledOutputFile::writeTile((int)local_108,iVar3,*pvVar10,local_184);
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970);
      Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x213c69);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff970);
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_108);
  poVar6 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  pcVar9 = local_8;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)&local_240,pcVar9,iVar3);
  Imf_3_4::TiledInputFile::header();
  local_248 = (int *)Imf_3_4::Header::dataWindow();
  local_24c = *local_248;
  local_250 = local_248[1];
  local_254 = Imf_3_4::TiledInputFile::numXLevels();
  local_258 = Imf_3_4::TiledInputFile::numYLevels();
  Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::Array2D
            ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)
             CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),in_stack_fffffffffffff9b8
             ,in_stack_fffffffffffff9b0);
  for (local_280 = 0; iVar3 = local_280, iVar5 = Imf_3_4::TiledInputFile::numYLevels(),
      iVar3 < iVar5; local_280 = local_280 + 1) {
    if ((((local_14 == 1) && ((local_1e & 1) == 0)) || ((local_14 == 0 && ((local_1e & 1) != 0))))
       || ((local_14 == 2 && ((local_1e & 1) != 0)))) {
      local_274 = Imf_3_4::TiledInputFile::numYTiles((int)&local_240);
      local_274 = local_274 + -1;
      local_278 = -1;
      local_27c = -1;
    }
    else {
      local_274 = 0;
      local_278 = Imf_3_4::TiledInputFile::numYTiles((int)&local_240);
      local_27c = 1;
    }
    for (local_284 = 0; iVar3 = local_284, iVar5 = Imf_3_4::TiledInputFile::numXLevels(),
        iVar3 < iVar5; local_284 = local_284 + 1) {
      local_288 = Imf_3_4::TiledInputFile::levelWidth((int)&local_240);
      local_28c = Imf_3_4::TiledInputFile::levelHeight((int)&local_240);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::operator[](&local_270,(long)local_280);
      Imf_3_4::Array2D<Imath_3_2::half>::resizeErase
                ((Array2D<Imath_3_2::half> *)in_stack_fffffffffffff980,
                 CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                 (long)in_stack_fffffffffffff970);
      Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x214088);
      pAVar12 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::operator[]
                          (&local_270,(long)local_280);
      phVar13 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](pAVar12 + local_284,(long)-local_250);
      in_stack_fffffffffffff968 = 0;
      in_stack_fffffffffffff960 = 0;
      Imf_3_4::Slice::Slice
                (local_2f8,HALF,(char *)(phVar13 + -local_24c),2,(long)local_288 * 2,1,1,0.0,false,
                 false);
      Imf_3_4::FrameBuffer::insert(local_2c0,(Slice *)0x231e2f);
      Imf_3_4::TiledInputFile::setFrameBuffer(&local_240);
      for (local_2fc = local_274; local_2fc != local_278; local_2fc = local_27c + local_2fc) {
        for (local_300 = 0; iVar3 = Imf_3_4::TiledInputFile::numXTiles((int)&local_240),
            local_300 < iVar3; local_300 = local_300 + 1) {
          Imf_3_4::TiledInputFile::readTile((int)&local_240,local_300,local_2fc,local_284);
        }
      }
      Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x214251);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::operator<<(poVar6,std::flush<char,std::char_traits<char>>);
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::displayWindow();
  Imf_3_4::Header::displayWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffff970,
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  if (!bVar1) {
    __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                  ,600,
                  "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffff970,
                     (Box<Imath_3_2::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
  if (!bVar1) {
    __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                  ,0x259,
                  "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pfVar14 = (float *)Imf_3_4::Header::pixelAspectRatio();
  fVar16 = *pfVar14;
  pfVar14 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if ((fVar16 != *pfVar14) || (NAN(fVar16) || NAN(*pfVar14))) {
    __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                  ,0x25a,
                  "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  this_00 = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  bVar1 = Imath_3_2::Vec2<float>::operator==(this_00,v);
  if (!bVar1) {
    __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                  ,0x25c,
                  "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  pfVar14 = (float *)Imf_3_4::Header::screenWindowWidth();
  fVar16 = *pfVar14;
  pfVar14 = (float *)Imf_3_4::Header::screenWindowWidth();
  if ((fVar16 != *pfVar14) || (NAN(fVar16) || NAN(*pfVar14))) {
    __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                  ,0x25d,
                  "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  piVar7 = (int *)Imf_3_4::Header::lineOrder();
  iVar3 = *piVar7;
  piVar7 = (int *)Imf_3_4::Header::lineOrder();
  if (iVar3 != *piVar7) {
    __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                  ,0x25e,
                  "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  piVar7 = (int *)Imf_3_4::Header::compression();
  iVar3 = *piVar7;
  piVar7 = (int *)Imf_3_4::Header::compression();
  if (iVar3 != *piVar7) {
    __assert_fail("in.header ().compression () == hdr.compression ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                  ,0x25f,
                  "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                 );
  }
  Imf_3_4::TiledInputFile::header();
  this_01 = (ChannelList *)Imf_3_4::Header::channels();
  pCVar15 = (ChannelList *)Imf_3_4::Header::channels();
  bVar2 = Imf_3_4::ChannelList::operator==(this_01,pCVar15);
  if ((bVar2 & 1) == 0) {
    __assert_fail("in.header ().channels () == hdr.channels ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                  ,0x260,
                  "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                 );
  }
  local_304 = 0;
  do {
    if (local_258 <= local_304) {
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array2D(in_stack_fffffffffffff980);
      Imf_3_4::TiledInputFile::~TiledInputFile
                ((TiledInputFile *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
      remove(local_8);
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array2D(in_stack_fffffffffffff980);
      Imf_3_4::Header::~Header((Header *)local_58);
      return;
    }
    for (local_308 = 0; local_308 < local_254; local_308 = local_308 + 1) {
      for (local_30c = 0; iVar3 = Imf_3_4::TiledInputFile::levelHeight((int)&local_240),
          local_30c < iVar3; local_30c = local_30c + 1) {
        for (local_310 = 0; iVar3 = Imf_3_4::TiledInputFile::levelWidth((int)&local_240),
            local_310 < iVar3; local_310 = local_310 + 1) {
          pAVar12 = Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::operator[]
                              (&local_270,(long)local_304);
          Imf_3_4::Array2D<Imath_3_2::half>::operator[](pAVar12 + local_308,(long)local_30c);
          fVar16 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
          ;
          in_stack_fffffffffffff980 =
               (Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)
               Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::operator[]
                         ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)(local_108 + 0x20),
                          (long)local_304);
          Imf_3_4::Array2D<Imath_3_2::half>::operator[]
                    ((Array2D<Imath_3_2::half> *)(in_stack_fffffffffffff980 + local_308),
                     (long)local_30c);
          fVar17 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960))
          ;
          if ((fVar16 != fVar17) || (NAN(fVar16) || NAN(fVar17))) {
            __assert_fail("(levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledLineOrder.cpp"
                          ,0x267,
                          "void (anonymous namespace)::writeCopyReadRIP(const char *, int, int, LineOrder, LevelRoundingMode, int, int, Compression, bool, bool)"
                         );
          }
        }
      }
    }
    local_304 = local_304 + 1;
  } while( true );
}

Assistant:

void
writeCopyReadRIP (
    const char        fileName[],
    int               width,
    int               height,
    LineOrder         lorder,
    LevelRoundingMode rmode,
    int               xSize,
    int               ySize,
    Compression       comp,
    bool              triggerBuffering,
    bool              triggerSeeks)
{
    cout << "LineOrder " << lorder << ", buffer " << triggerBuffering
         << ", seek " << triggerSeeks << ", levelMode 2, "
         << "roundingMode " << rmode
         << ", "
            "compression "
         << comp << endl;

    Header hdr (
        (Box2i (
            V2i (0, 0), // display window
            V2i (width - 1, height - 1))),
        (Box2i (
            V2i (0, 0), // data window
            V2i (width - 1, height - 1))));

    hdr.compression () = comp;
    hdr.lineOrder ()   = INCREASING_Y;
    hdr.channels ().insert ("H", Channel (HALF, 1, 1));

    hdr.setTileDescription (
        TileDescription (xSize, ySize, RIPMAP_LEVELS, rmode));

    Array2D<Array2D<half>> levels;

    {
        cout << " writing" << flush;

        remove (fileName);
        TiledOutputFile out (fileName, hdr);

        levels.resizeErase (out.numYLevels (), out.numXLevels ());

        int i;

        Rand32           rand1 = Rand32 ();
        std::vector<int> shuffled_xLevels =
            std::vector<int> (out.numXLevels ());
        std::vector<int> shuffled_yLevels =
            std::vector<int> (out.numYLevels ());

        for (i = 0; i < out.numXLevels (); i++)
            shuffled_xLevels[i] = i;

        for (i = 0; i < out.numYLevels (); i++)
            shuffled_yLevels[i] = i;

        if (triggerBuffering)
        {
            // shuffle the level orders
            for (i = 0; i < out.numXLevels (); i++)
                std::swap (
                    shuffled_xLevels[i],
                    shuffled_xLevels[int (
                        rand1.nextf (i, out.numXLevels () - 1) + 0.5)]);

            for (i = 0; i < out.numYLevels (); i++)
                std::swap (
                    shuffled_yLevels[i],
                    shuffled_yLevels[int (
                        rand1.nextf (i, out.numYLevels () - 1) + 0.5)]);
        }

        for (int ylevel = 0; ylevel < out.numYLevels (); ++ylevel)
        {
            const int sylevel = shuffled_yLevels[ylevel];

            std::vector<int> tileYs =
                std::vector<int> (out.numYTiles (sylevel));
            for (i = 0; i < out.numYTiles (sylevel); i++)
            {
                if (lorder == DECREASING_Y)
                    tileYs[out.numYTiles (sylevel) - 1 - i] = i;
                else
                    tileYs[i] = i;
            }

            if (triggerBuffering)
                // shuffle the tile orders
                for (i = 0; i < out.numYTiles (sylevel); i++)
                    std::swap (
                        tileYs[i],
                        tileYs[int (
                            rand1.nextf (i, out.numYTiles (sylevel) - 1) +
                            0.5)]);

            for (int xlevel = 0; xlevel < out.numXLevels (); ++xlevel)
            {
                const int sxlevel = shuffled_xLevels[xlevel];

                int levelWidth  = out.levelWidth (sxlevel);
                int levelHeight = out.levelHeight (sylevel);
                levels[sylevel][sxlevel].resizeErase (levelHeight, levelWidth);
                fillPixels (levels[sylevel][sxlevel], levelWidth, levelHeight);

                FrameBuffer fb;
                fb.insert (
                    "H",
                    Slice (
                        HALF,
                        (char*) &levels[sylevel][sxlevel][0][0],
                        sizeof (levels[sylevel][sxlevel][0][0]),
                        sizeof (levels[sylevel][sxlevel][0][0]) * levelWidth));

                out.setFrameBuffer (fb);

                std::vector<int> tileXs =
                    std::vector<int> (out.numXTiles (sxlevel));
                for (i = 0; i < out.numXTiles (sxlevel); i++)
                    tileXs[i] = i;

                if (triggerBuffering)
                    // shuffle the tile orders
                    for (i = 0; i < out.numXTiles (sxlevel); i++)
                        std::swap (
                            tileXs[i],
                            tileXs[int (
                                rand1.nextf (i, out.numXTiles (sxlevel) - 1) +
                                0.5)]);

                for (int tileY = 0; tileY < out.numYTiles (sylevel); ++tileY)
                    for (int tileX = 0; tileX < out.numXTiles (sxlevel);
                         ++tileX)
                        out.writeTile (
                            tileXs[tileX], tileYs[tileY], sxlevel, sylevel);
            }
        }
    }

    {
        cout << " reading" << flush;

        TiledInputFile in (fileName);

        const Box2i& dw  = in.header ().dataWindow ();
        int          dwx = dw.min.x;
        int          dwy = dw.min.y;

        int                    numXLevels = in.numXLevels ();
        int                    numYLevels = in.numYLevels ();
        Array2D<Array2D<half>> levels2 (numYLevels, numXLevels);

        int startTileY, endTileY;
        int dy;

        for (int ylevel = 0; ylevel < in.numYLevels (); ++ylevel)
        {
            if ((lorder == DECREASING_Y && !triggerSeeks) ||
                (lorder == INCREASING_Y && triggerSeeks) ||
                (lorder == RANDOM_Y && triggerSeeks))
            {
                startTileY = in.numYTiles (ylevel) - 1;
                endTileY   = -1;

                dy = -1;
            }
            else
            {
                startTileY = 0;
                endTileY   = in.numYTiles (ylevel);

                dy = 1;
            }

            for (int xlevel = 0; xlevel < in.numXLevels (); ++xlevel)
            {
                int levelWidth  = in.levelWidth (xlevel);
                int levelHeight = in.levelHeight (ylevel);
                levels2[ylevel][xlevel].resizeErase (levelHeight, levelWidth);

                FrameBuffer fb;
                fb.insert (
                    "H",
                    Slice (
                        HALF,
                        (char*) &levels2[ylevel][xlevel][-dwy][-dwx],
                        sizeof (levels2[ylevel][xlevel][0][0]),
                        sizeof (levels2[ylevel][xlevel][0][0]) * levelWidth));

                in.setFrameBuffer (fb);

                for (int tileY = startTileY; tileY != endTileY; tileY += dy)
                    for (int tileX = 0; tileX < in.numXTiles (xlevel); ++tileX)
                        in.readTile (tileX, tileY, xlevel, ylevel);
            }
        }

        cout << " comparing" << flush;

        assert (in.header ().displayWindow () == hdr.displayWindow ());
        assert (in.header ().dataWindow () == hdr.dataWindow ());
        assert (in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ());
        assert (
            in.header ().screenWindowCenter () == hdr.screenWindowCenter ());
        assert (in.header ().screenWindowWidth () == hdr.screenWindowWidth ());
        assert (in.header ().lineOrder () == hdr.lineOrder ());
        assert (in.header ().compression () == hdr.compression ());
        assert (in.header ().channels () == hdr.channels ());

        for (int ly = 0; ly < numYLevels; ++ly)
            for (int lx = 0; lx < numXLevels; ++lx)
                for (int y = 0; y < in.levelHeight (ly); ++y)
                    for (int x = 0; x < in.levelWidth (lx); ++x)
                        assert (
                            (levels2[ly][lx])[y][x] == (levels[ly][lx])[y][x]);
    }

    remove (fileName);
    cout << endl;
}